

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O1

ConcreteType * __thiscall
soul::PoolAllocator::allocate<soul::AST::ConcreteType,soul::AST::Context_const&,soul::Type>
          (PoolAllocator *this,Context *args,Type *args_1)

{
  PoolItem *pPVar1;
  Type local_38;
  
  pPVar1 = allocateSpaceForObject(this,0x48);
  local_38.category = args_1->category;
  local_38.arrayElementCategory = args_1->arrayElementCategory;
  local_38.isRef = args_1->isRef;
  local_38.isConstant = args_1->isConstant;
  local_38.primitiveType.type = (args_1->primitiveType).type;
  local_38.boundingSize = args_1->boundingSize;
  local_38.arrayElementBoundingSize = args_1->arrayElementBoundingSize;
  local_38.structure.object = (args_1->structure).object;
  (args_1->structure).object = (Structure *)0x0;
  AST::ConcreteType::ConcreteType((ConcreteType *)&pPVar1->item,args,&local_38);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_38.structure.object);
  pPVar1->destructor =
       allocate<soul::AST::ConcreteType,_const_soul::AST::Context_&,_soul::Type>::
       anon_class_1_0_00000001::__invoke;
  return (ConcreteType *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }